

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mustache.cpp
# Opt level: O0

void __thiscall TestMustache::testConformance(TestMustache *this)

{
  int iVar1;
  QMap<QString,_QVariant> *pQVar2;
  QString *pQVar3;
  QHash<QString,_QString> *other;
  undefined1 local_180 [8];
  QString output;
  undefined1 local_148 [8];
  QtVariantContext context;
  PartialMap partialsMap;
  Renderer renderer;
  QString expected;
  PartialsHash partials;
  undefined1 local_30 [8];
  QString template_;
  QVariantMap data;
  TestMustache *this_local;
  
  iVar1 = qMetaTypeId<QMap<QString,QVariant>>();
  pQVar2 = (QMap<QString,_QVariant> *)QTest::qData("data",iVar1);
  QMap<QString,_QVariant>::QMap((QMap<QString,_QVariant> *)&template_.d.size,pQVar2);
  iVar1 = qMetaTypeId<QString>();
  pQVar3 = (QString *)QTest::qData("template_",iVar1);
  QString::QString((QString *)local_30,pQVar3);
  iVar1 = qMetaTypeId<QHash<QString,QString>>();
  other = (QHash<QString,_QString> *)QTest::qData("partials",iVar1);
  QHash<QString,_QString>::QHash((QHash<QString,_QString> *)&expected.d.size,other);
  iVar1 = qMetaTypeId<QString>();
  pQVar3 = (QString *)QTest::qData("expected",iVar1);
  QString::QString((QString *)&renderer.m_defaultTagEndMarker.d.size,pQVar3);
  Mustache::Renderer::Renderer((Renderer *)&partialsMap.m_partials);
  Mustache::PartialMap::PartialMap
            ((PartialMap *)&context.m_contextStack.super_QList<QVariant>.d.size,
             (QHash<QString,_QString> *)&expected.d.size);
  ::QVariant::QVariant((QVariant *)&output.d.size,(QMap *)&template_.d.size);
  Mustache::QtVariantContext::QtVariantContext
            ((QtVariantContext *)local_148,(QVariant *)&output.d.size,
             (PartialResolver *)&context.m_contextStack.super_QList<QVariant>.d.size);
  ::QVariant::~QVariant((QVariant *)&output.d.size);
  Mustache::Renderer::render
            ((QString *)local_180,(Renderer *)&partialsMap.m_partials,(QString *)local_30,
             (Context *)local_148);
  QTest::qCompare((QString *)local_180,(QString *)&renderer.m_defaultTagEndMarker.d.size,"output",
                  "expected",
                  "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                  ,0x212);
  QString::~QString((QString *)local_180);
  Mustache::QtVariantContext::~QtVariantContext((QtVariantContext *)local_148);
  Mustache::PartialMap::~PartialMap
            ((PartialMap *)&context.m_contextStack.super_QList<QVariant>.d.size);
  Mustache::Renderer::~Renderer((Renderer *)&partialsMap.m_partials);
  QString::~QString((QString *)&renderer.m_defaultTagEndMarker.d.size);
  QHash<QString,_QString>::~QHash((QHash<QString,_QString> *)&expected.d.size);
  QString::~QString((QString *)local_30);
  QMap<QString,_QVariant>::~QMap((QMap<QString,_QVariant> *)&template_.d.size);
  return;
}

Assistant:

void TestMustache::testConformance()
{
	QFETCH(QVariantMap, data);
	QFETCH(QString, template_);
	QFETCH(PartialsHash, partials);
	QFETCH(QString, expected);

	Mustache::Renderer renderer;
	Mustache::PartialMap partialsMap(partials);
	Mustache::QtVariantContext context(data, &partialsMap);

	QString output = renderer.render(template_, &context);

	QCOMPARE(output, expected);
}